

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O2

void Abc_NtkVectorPrintVars(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues,int nPars)

{
  uint uVar1;
  
  for (; nPars < pNtk->vPis->nSize; nPars = nPars + 1) {
    uVar1 = Vec_IntEntry(vPiValues,nPars);
    printf("%d",(ulong)uVar1);
  }
  return;
}

Assistant:

void Abc_NtkVectorPrintVars( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues, int nPars )
{
    int i;
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        printf( "%d", Vec_IntEntry(vPiValues,i) );
}